

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cpp
# Opt level: O3

int __thiscall
Filter::searchRadius
          (Filter *this,TRIPLEYCbCr **mrx,TRIPLEYCbCr **mrxNoize,int min,int max,
          BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,char *filepath,double sigma)

{
  uint __val;
  BITMAPINFOHEADER bmInfo_00;
  BITMAPINFOHEADER BVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  uint __len;
  ulong uVar8;
  double dVar9;
  BITMAPFILEHEADER bmFile_00;
  string filename;
  string __str_1;
  string path;
  double local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  ulong local_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  unsigned_short local_f0;
  unsigned_short uStack_ee;
  uint uStack_ec;
  undefined1 local_e8 [16];
  Filter *local_d8;
  TRIPLEYCbCr **local_d0;
  double local_c8;
  ulong local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  uint local_38;
  uint uStack_34;
  TRIPLEBYTES **mrx2;
  
  BVar1 = bmInfo;
  local_e8._8_8_ = mrx;
  local_d8 = this;
  local_d0 = mrxNoize;
  local_c8 = sigma;
  printf("Search radius(%s):\n",filepath);
  uVar6 = (ulong)bmInfo.biHeight;
  std::__cxx11::string::string((string *)&local_78,filepath,(allocator *)&local_138);
  std::operator+(&local_138,"mkdir -p ",&local_78);
  system(local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  iVar3 = 0;
  if (min < max) {
    local_e8._0_2_ = bmFile.bfType;
    local_e8._2_2_ = bmFile._2_2_;
    local_e8._4_4_ = bmFile.bfSize;
    local_f0 = bmFile.bfReserved1;
    uStack_ee = bmFile.bfReserved2;
    uStack_ec = bmFile.bfOffBits;
    local_148 = 0.0;
    uVar8 = 0;
    local_118 = uVar6;
    do {
      iVar3 = (**local_d8->_vptr_Filter)
                        (local_c8,local_d8,local_d0,uVar6 & 0xffffffff,(ulong)bmInfo.biWidth,
                         (ulong)(uint)min);
      mrx2 = (TRIPLEBYTES **)CONCAT44(extraout_var,iVar3);
      dVar9 = getPSNR((TRIPLEBYTES **)local_e8._8_8_,mrx2,min,min,(int)uVar6 - min,
                      bmInfo.biWidth - min,0);
      uVar8 = uVar8 & 0xffffffff;
      if (local_148 < dVar9) {
        uVar8 = (ulong)(uint)min;
      }
      printf("R = %3d\tPSNR[f,f] = %5.3f\n",(ulong)(uint)min);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      local_c0 = uVar8;
      std::__cxx11::string::append((char *)&local_138);
      local_38 = bmInfo.biClrUsed;
      uStack_34 = bmInfo.biClrImportant;
      local_58 = BVar1._0_8_;
      uStack_50 = BVar1._8_8_;
      local_48 = bmInfo.biCompression;
      uStack_44 = bmInfo.biSizeImage;
      uStack_40 = bmInfo.biXPelsPerMeter;
      uStack_3c = bmInfo.biYPelsPerMeter;
      __val = -min;
      if (0 < min) {
        __val = min;
      }
      __len = 1;
      if (9 < __val) {
        uVar6 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar4 = (uint)uVar6;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_00106231;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_00106231;
          }
          if (uVar4 < 10000) goto LAB_00106231;
          uVar6 = uVar6 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_00106231:
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct((ulong)local_b8,(char)-(min >> 0x1f) + (char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_b8[0] + (uint)-(min >> 0x1f),__len,__val);
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_b8,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
      uVar6 = local_118;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_100 = *plVar7;
        lStack_f8 = plVar5[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar7;
        local_110 = (long *)*plVar5;
      }
      local_108 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_88 = *plVar7;
        lStack_80 = plVar5[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar7;
        local_98 = (long *)*plVar5;
      }
      local_90 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      bmInfo_00.biHeight = (undefined4)uStack_50;
      bmInfo_00.biPlanes = uStack_50._4_2_;
      bmInfo_00.biBitCount = uStack_50._6_2_;
      bmInfo_00.biSize = (undefined4)local_58;
      bmInfo_00.biWidth = local_58._4_4_;
      bmInfo_00.biCompression = local_48;
      bmInfo_00.biSizeImage = uStack_44;
      bmInfo_00.biXPelsPerMeter = uStack_40;
      bmInfo_00.biYPelsPerMeter = uStack_3c;
      bmInfo_00.biClrUsed = local_38;
      bmInfo_00.biClrImportant = uStack_34;
      bmFile_00.bfReserved1 = local_f0;
      bmFile_00.bfReserved2 = uStack_ee;
      bmFile_00.bfOffBits = uStack_ec;
      bmFile_00.bfType = local_e8._0_2_;
      bmFile_00._2_2_ = local_e8._2_2_;
      bmFile_00.bfSize = local_e8._4_4_;
      save_component_to_files(mrx2,bmFile_00,bmInfo_00,0,(char *)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
      if ((int)uVar6 < 1) {
        if (mrx2 != (TRIPLEBYTES **)0x0) goto LAB_00106403;
      }
      else {
        uVar8 = 0;
        do {
          if (mrx2[uVar8] != (TRIPLEBYTES *)0x0) {
            operator_delete__(mrx2[uVar8]);
          }
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
LAB_00106403:
        operator_delete__(mrx2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if (dVar9 <= local_148) {
        dVar9 = local_148;
      }
      min = min + 1;
      iVar3 = (int)local_c0;
      uVar8 = local_c0;
      local_148 = dVar9;
    } while (min != max);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return iVar3;
}

Assistant:

int Filter::searchRadius(TRIPLEYCbCr **mrx, TRIPLEYCbCr **mrxNoize, int min, int max, BITMAPFILEHEADER bmFile,
                         BITMAPINFOHEADER bmInfo, const char *filepath, double sigma) {
    printf("Search radius(%s):\n", filepath);
    int h = bmInfo.biHeight;
    int w = bmInfo.biWidth;
    double maxPSNR = 0;
    int maxRadius = 0;
    double psnr;
    std::string path = filepath;
    system(("mkdir -p " + path).c_str());
    for (int r = min; r < max; r++) {
        TRIPLERGB **mrxf = (TRIPLERGB **) apply_filter(mrxNoize, h, w, r, sigma);
        psnr = getPSNR((TRIPLEBYTES **) mrx, (TRIPLEBYTES **) mrxf, r, r, h - r, w - r, COMPONENT_Y);
        if (maxPSNR < psnr) {
            maxPSNR = psnr;
            maxRadius = r;
        }
        printf("R = %3d\tPSNR[f,f] = %5.3f\n", r, psnr);
        std::string filename = path + "/radius_";//.bmp";
        save_component_to_files((TRIPLEBYTES **) mrxf, bmFile, bmInfo, COMPONENT_Y,
                                (filename + std::to_string(r) + ".bmp").c_str());
        for (int i = 0; i < h; i++) {
            delete[]mrxf[i];
        }
        delete[] mrxf;
    }
    return maxRadius;
}